

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O1

void innalg(double *vec,int l,int N,double *v,double *theta)

{
  uint M;
  double *acov;
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  
  M = N + 1;
  acov = (double *)malloc((long)N * 8 + 8);
  autocovar(vec,l,acov,M);
  *v = *acov;
  uVar1 = (ulong)M;
  if (-1 < N) {
    uVar6 = 0;
    uVar2 = uVar1;
    do {
      memset(theta + uVar6,0,uVar1 * 8);
      uVar6 = (ulong)((int)uVar6 + M);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (0 < N) {
    pdVar3 = theta + uVar1 + 1;
    uVar2 = 1;
    do {
      iVar5 = 0;
      uVar6 = 0;
      do {
        if (uVar6 == 0) {
          dVar8 = 0.0;
        }
        else {
          dVar8 = 0.0;
          lVar7 = 0;
          pdVar4 = v;
          do {
            dVar8 = dVar8 + theta[iVar5 + lVar7] * pdVar3[lVar7] * *pdVar4;
            lVar7 = lVar7 + -1;
            pdVar4 = pdVar4 + 1;
          } while (uVar6 + lVar7 != 0);
        }
        theta[(uVar2 * uVar1 + uVar2) - uVar6] = (acov[uVar2 - uVar6] - dVar8) / v[uVar6];
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + N + 2;
      } while (uVar6 != uVar2);
      dVar8 = 0.0;
      uVar6 = 0;
      pdVar4 = pdVar3;
      do {
        dVar8 = dVar8 + v[uVar6] * *pdVar4 * *pdVar4;
        uVar6 = uVar6 + 1;
        pdVar4 = pdVar4 + -1;
      } while (uVar2 != uVar6);
      v[uVar2] = *v - dVar8;
      uVar2 = uVar2 + 1;
      pdVar3 = pdVar3 + uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  free(acov);
  return;
}

Assistant:

void innalg(double *vec, int l, int N,double *v, double *theta) {
	int i,j,lag,ct,ct2,index1,index2;
	double temp,temp2;
	double *acov;
	// IMPORTANT - The program does not store the matrix as laid out
	// in Brockwell and Davis

	// theta is a (N+1)X(N+1) matrix so choose the value of N accordingly. The recommended
	// value is N = 17 which will make theta a 18*18 double vector so allocate memory
	// accordingly.

	// theta11 is accessed at theta[1*(N+1) + 1]

	// with thetaxy accessed at theta[x*(N+1)+y]

	// The coefficients of Moving Average MA(q) are stored at
	// theta[N*(N+1)+1+i] where i = 0,1,2,...,q-1. Multiply these entries by -1.0
	// to get the MA(q) coefficients.

	// Output v is a 1X(N+1) vector with v[0] = autocovariance at lag 0.

	// see ma_inn function below

	lag = N+1;

	acov = (double*) malloc(sizeof(double) * lag);
	autocovar(vec,l,acov,lag);
	//mdisplay(acov,1,lag);
	v[0] = acov[0];

	for(i = 0; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < lag;++j) {
			theta[index1+j] = 0.0;
		}
	}

	for(i = 1; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < i;++j) {
			index2 = j * lag;
			temp = 0.0;
			for(ct = 0; ct < j;++ct) {
				temp += (theta[index2 + j - ct] * theta[index1 + i - ct]* v[ct]);
			}
			theta[index1 + i - j] = (acov[i-j]-temp)*1.0/v[j];
		}
		temp2 = 0.0;

		for(ct2 = 0; ct2 < i;++ct2) {
			temp2 += (v[ct2]*theta[index1 + i - ct2]*theta[index1 + i - ct2]);
		}

		v[i]=v[0]-temp2;
	}


	free(acov);
}